

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void lsvm::object::free_package(package *pkg)

{
  entry *peVar1;
  iterator it;
  iterator iStack_38;
  
  hashmap::get_iterator(&iStack_38,pkg->classes);
  while( true ) {
    peVar1 = hashmap::next(&iStack_38);
    if (peVar1 == (entry *)0x0) break;
    free_class((object_class *)peVar1->val);
  }
  hashmap::free(pkg->classes);
  memory::retain(pkg);
  return;
}

Assistant:

void free_package(package* pkg){
    lsvm::hashmap::iterator it = lsvm::hashmap::get_iterator(pkg->classes);
    lsvm::hashmap::entry* e;
    while((e = lsvm::hashmap::next(&it)) != null){
        lsvm::object::free_class((object_class*)e->val);    
    }
    lsvm::symbol::free_symbolmap(pkg->classes);
    lsvm::memory::retain(pkg);
}